

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

spv_result_t __thiscall
anon_unknown.dwarf_37c69a::Parser::exhaustedInputDiagnostic
          (Parser *this,size_t inst_offset,Op opcode,spv_operand_type_t type)

{
  spv_result_t sVar1;
  DiagnosticStream *pDVar2;
  unsigned_long local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  DiagnosticStream local_1f8;
  spv_operand_type_t local_20;
  Op local_1c;
  spv_operand_type_t type_local;
  Op opcode_local;
  size_t inst_offset_local;
  Parser *this_local;
  
  local_20 = type;
  local_1c = opcode;
  _type_local = inst_offset;
  inst_offset_local = (size_t)this;
  diagnostic(&local_1f8,this);
  pDVar2 = spvtools::DiagnosticStream::operator<<
                     (&local_1f8,(char (*) [39])"End of input reached while decoding Op");
  local_200 = spvOpcodeString(local_1c);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_200);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,(char (*) [19])" starting at word ");
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,(unsigned_long *)&type_local);
  local_208 = ": missing ";
  if ((this->_).word_index < (this->_).num_words) {
    local_208 = ": truncated ";
  }
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_208);
  local_210 = spvOperandTypeStr(local_20);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_210);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,(char (*) [25])" operand at word offset ");
  local_218 = (this->_).word_index - _type_local;
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_218);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,(char (*) [2])0x565143);
  sVar1 = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
  spvtools::DiagnosticStream::~DiagnosticStream(&local_1f8);
  return sVar1;
}

Assistant:

spv_result_t exhaustedInputDiagnostic(size_t inst_offset, spv::Op opcode,
                                        spv_operand_type_t type) {
    return diagnostic() << "End of input reached while decoding Op"
                        << spvOpcodeString(opcode) << " starting at word "
                        << inst_offset
                        << ((_.word_index < _.num_words) ? ": truncated "
                                                         : ": missing ")
                        << spvOperandTypeStr(type) << " operand at word offset "
                        << _.word_index - inst_offset << ".";
  }